

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

char * bif_stristr(char *s1,char *s2)

{
  int iVar1;
  size_t sVar2;
  char *in_RSI;
  char *in_RDI;
  size_t s2len;
  size_t s1len;
  size_t in_stack_00000020;
  void *in_stack_00000028;
  void *in_stack_00000030;
  ulong local_20;
  char *local_10;
  
  local_20 = strlen(in_RDI);
  sVar2 = strlen(in_RSI);
  local_10 = in_RDI;
  while( true ) {
    if (local_20 < sVar2) {
      return (char *)0x0;
    }
    iVar1 = memicmp(in_stack_00000030,in_stack_00000028,in_stack_00000020);
    if (iVar1 == 0) break;
    local_10 = local_10 + 1;
    local_20 = local_20 - 1;
  }
  return local_10;
}

Assistant:

static char *bif_stristr(const char *s1, const char *s2)
{
    size_t s1len;
    size_t s2len;

    /* scan for a match */
    for (s1len = strlen(s1), s2len = strlen(s2) ; s1len >= s2len ;
         ++s1, --s1len)
    {
        /* if this is a match, return this substring */
        if (memicmp(s1, s2, s2len) == 0)
            return (char *)s1;
    }

    return 0;
}